

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O3

BN * __thiscall BN::modbase(BN *__return_storage_ptr__,BN *this,bt *diviser)

{
  pointer puVar1;
  divide_by_zero *this_00;
  uint uVar2;
  unsigned_short uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (*diviser != 0) {
    puVar1 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = 0;
    uVar3 = 0;
    lVar4 = (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    if (lVar4 != 0) {
      uVar5 = lVar4 >> 1;
      uVar6 = uVar5 - 1;
      do {
        uVar2 = ((uint)puVar1[uVar6] | uVar2 << 0x10) % (uint)*diviser;
        uVar3 = (unsigned_short)uVar2;
        uVar6 = uVar6 - 1;
      } while (uVar6 < uVar5);
    }
    puVar1 = (pointer)operator_new(2);
    (__return_storage_ptr__->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar1;
    (__return_storage_ptr__->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar1 + 1;
    (__return_storage_ptr__->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1 + 1;
    *puVar1 = uVar3;
    return __return_storage_ptr__;
  }
  this_00 = (divide_by_zero *)__cxa_allocate_exception(0x10);
  divide_by_zero::divide_by_zero(this_00);
  __cxa_throw(this_00,&divide_by_zero::typeinfo,std::logic_error::~logic_error);
}

Assistant:

const BN BN::modbase(const bt &diviser)const
{
    if(diviser == 0)
        throw divide_by_zero();
    bt2 curr=0;
    for (size_t i = ba.size()- 1; i < ba.size(); --i) {
        curr <<= bz8;
        curr += ba[i];
        curr %= diviser;
    }

    BN result;
    result.ba[0]=curr;

    return result;
}